

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QString * __thiscall MakefileGenerator::fullBuildArgs(MakefileGenerator *this)

{
  bool bVar1;
  long *in_RSI;
  MakefileGenerator *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar2;
  QString *ret;
  QString ofile;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_0000035c;
  undefined4 in_stack_fffffffffffffdf8;
  FileFixifyType in_stack_fffffffffffffdfc;
  FileFixifyType flags;
  QStringView *in_stack_fffffffffffffe00;
  QString *in_stack_fffffffffffffe08;
  QStringView *in_stack_fffffffffffffe10;
  QStringView *this_00;
  QMakeEvaluator *in_stack_fffffffffffffe18;
  undefined1 *n;
  undefined1 withExtra;
  MakefileGenerator *this_01;
  bool local_1bc;
  qsizetype local_1a0;
  storage_type_conflict *local_198;
  undefined1 in_stack_fffffffffffffea7;
  QString *in_stack_fffffffffffffea8;
  MakefileGenerator *in_stack_fffffffffffffeb0;
  undefined1 local_140 [56];
  undefined1 local_108 [56];
  QString local_d0 [2];
  QStringView local_a0 [3];
  qsizetype local_70;
  storage_type_conflict *local_68;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo = (_func_int **)0xaaaaaaaaaaaaaaaa;
  (((QString *)&(in_RDI->super_QMakeSourceFileInfo).files)->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->super_QMakeSourceFileInfo).includes = (SourceFiles *)0xaaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QString::QString((QString *)0x1986f7);
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  QFile::fileName();
  QFlags<MakefileGenerator::FileFixifyType>::QFlags
            ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdfc);
  fileFixify(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (FileFixifyTypes)in_stack_0000035c.i,(bool)in_stack_fffffffffffffea7);
  QString::~QString((QString *)0x19877b);
  bVar1 = QString::isEmpty((QString *)0x198788);
  local_1bc = false;
  if (!bVar1) {
    QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe00 = (QStringView *)in_RSI[0x1b];
    in_stack_fffffffffffffe08 = local_d0;
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffe00,
                   (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    this_00 = local_a0;
    QMakeEvaluator::first(in_stack_fffffffffffffe18,(ProKey *)this_00);
    n = local_18;
    QStringView::QStringView<QString,_true>(this_00,in_stack_fffffffffffffe08);
    QVar2 = QStringView::mid(this_00,(qsizetype)in_RDI,(qsizetype)n);
    local_1a0 = QVar2.m_size;
    local_198 = QVar2.m_data;
    local_70 = local_1a0;
    local_68 = local_198;
    local_1bc = ::operator!=(in_stack_fffffffffffffe00,
                             (QStringView *)
                             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  flags = CONCAT13(local_1bc,(int3)in_stack_fffffffffffffdfc);
  if (!bVar1) {
    ProString::~ProString((ProString *)0x1988a0);
    ProKey::~ProKey((ProKey *)0x1988b6);
  }
  if ((flags & 0x1000000) != FileFixifyDefault) {
    (**(code **)(*in_RSI + 0x60))(local_108,in_RSI,&local_30);
    ::operator+((char (*) [5])in_stack_fffffffffffffe08,(QString *)in_stack_fffffffffffffe00);
    ::operator+=((QString *)this_01,(QStringBuilder<const_char_(&)[5],_QString> *)in_RDI);
    QStringBuilder<const_char_(&)[5],_QString>::~QStringBuilder
              ((QStringBuilder<const_char_(&)[5],_QString> *)0x198916);
    QString::~QString((QString *)0x198923);
  }
  QMakeProject::projectFile((QMakeProject *)CONCAT44(flags,in_stack_fffffffffffffdf8));
  QFlags<MakefileGenerator::FileFixifyType>::QFlags
            ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffe00,flags);
  fileFixify(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (FileFixifyTypes)in_stack_0000035c.i,(bool)in_stack_fffffffffffffea7);
  (**(code **)(*in_RSI + 0x60))(local_140,in_RSI,&stack0xfffffffffffffea8);
  ::operator+((char (*) [2])in_stack_fffffffffffffe08,(QString *)in_stack_fffffffffffffe00);
  ::operator+=((QString *)this_01,(QStringBuilder<const_char_(&)[2],_QString> *)in_RDI);
  withExtra = (undefined1)((ulong)in_RDI >> 0x38);
  QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
            ((QStringBuilder<const_char_(&)[2],_QString> *)0x1989c8);
  QString::~QString((QString *)0x1989d5);
  QString::~QString((QString *)0x1989e2);
  QString::~QString((QString *)0x1989ef);
  buildArgs(this_01,(bool)withExtra);
  QString::operator+=((QString *)in_stack_fffffffffffffe00,
                      (QString *)CONCAT44(flags,in_stack_fffffffffffffdf8));
  QString::~QString((QString *)0x198a1c);
  QString::~QString((QString *)0x198a2e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QString MakefileGenerator::fullBuildArgs()
{
    QString ret;

    //output
    QString ofile = fileFixify(Option::output.fileName());
    if (!ofile.isEmpty() && ofile != project->first("QMAKE_MAKEFILE").toQStringView())
        ret += " -o " + escapeFilePath(ofile);

    //inputs
    ret += " " + escapeFilePath(fileFixify(project->projectFile()));

    // general options and arguments
    ret += buildArgs(true);

    return ret;
}